

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_export.c
# Opt level: O0

REF_STATUS ref_export_ugrid(REF_GRID ref_grid,char *filename)

{
  uint uVar1;
  REF_STATUS RVar2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT max_faceid;
  REF_INT min_faceid;
  REF_INT faceid;
  REF_INT group;
  REF_INT cell;
  REF_INT node_per;
  REF_INT nodes [27];
  REF_INT nhex;
  REF_INT npri;
  REF_INT npyr;
  REF_INT ntet;
  REF_INT nqua;
  REF_INT ntri;
  REF_INT nnode;
  REF_INT *n2o;
  REF_INT *o2n;
  REF_CELL pRStack_38;
  REF_INT node;
  REF_CELL ref_cell;
  REF_NODE ref_node;
  FILE *file;
  char *filename_local;
  REF_GRID ref_grid_local;
  
  ref_cell = (REF_CELL)ref_grid->node;
  file = (FILE *)filename;
  filename_local = (char *)ref_grid;
  ref_node = (REF_NODE)fopen(filename,"w");
  if ((FILE *)ref_node == (FILE *)0x0) {
    printf("unable to open %s\n",file);
  }
  if (ref_node == (REF_NODE)0x0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c",0x5b5,
           "ref_export_ugrid","unable to open file");
    ref_grid_local._4_4_ = 2;
  }
  else {
    nodes[0x1a] = *(REF_INT *)(*(long *)(filename_local + 0x60) + 0x28);
    nodes[0x19] = *(REF_INT *)(*(long *)(filename_local + 0x68) + 0x28);
    fprintf((FILE *)ref_node,"%d %d %d %d %d %d %d\n",(ulong)ref_cell->type,
            (ulong)*(uint *)(*(long *)(filename_local + 0x28) + 0x28),
            (ulong)*(uint *)(*(long *)(filename_local + 0x40) + 0x28),
            (ulong)*(uint *)(*(long *)(filename_local + 0x50) + 0x28),
            *(undefined4 *)(*(long *)(filename_local + 0x58) + 0x28),nodes[0x1a],nodes[0x19]);
    uVar1 = ref_node_compact((REF_NODE)ref_cell,&n2o,(REF_INT **)&ntri);
    if (uVar1 == 0) {
      for (o2n._4_4_ = 0; o2n._4_4_ < (int)ref_cell->type; o2n._4_4_ = o2n._4_4_ + 1) {
        fprintf((FILE *)ref_node," %.16e %.16e %.16e\n",
                *(undefined8 *)(ref_cell->c2n + (long)(_ntri[o2n._4_4_] * 0xf) * 2),
                *(undefined8 *)(ref_cell->c2n + (long)(_ntri[o2n._4_4_] * 0xf + 1) * 2),
                *(undefined8 *)(ref_cell->c2n + (long)(_ntri[o2n._4_4_] * 0xf + 2) * 2));
      }
      uVar1 = ref_export_faceid_range
                        ((REF_GRID)filename_local,&ref_private_macro_code_rss,
                         &ref_private_macro_code_rss_1);
      if (uVar1 == 0) {
        pRStack_38 = *(REF_CELL *)(filename_local + 0x28);
        group = pRStack_38->node_per;
        for (max_faceid = ref_private_macro_code_rss; max_faceid <= ref_private_macro_code_rss_1;
            max_faceid = max_faceid + 1) {
          for (faceid = 0; faceid < pRStack_38->max; faceid = faceid + 1) {
            RVar2 = ref_cell_nodes(pRStack_38,faceid,&cell);
            if ((RVar2 == 0) && ((&cell)[group] == max_faceid)) {
              for (o2n._4_4_ = 0; o2n._4_4_ < group; o2n._4_4_ = o2n._4_4_ + 1) {
                fprintf((FILE *)ref_node," %d",(ulong)(n2o[(&cell)[o2n._4_4_]] + 1));
              }
              fprintf((FILE *)ref_node,"\n");
            }
          }
        }
        pRStack_38 = *(REF_CELL *)(filename_local + 0x40);
        group = pRStack_38->node_per;
        for (max_faceid = ref_private_macro_code_rss; max_faceid <= ref_private_macro_code_rss_1;
            max_faceid = max_faceid + 1) {
          for (faceid = 0; faceid < pRStack_38->max; faceid = faceid + 1) {
            RVar2 = ref_cell_nodes(pRStack_38,faceid,&cell);
            if ((RVar2 == 0) && ((&cell)[group] == max_faceid)) {
              for (o2n._4_4_ = 0; o2n._4_4_ < group; o2n._4_4_ = o2n._4_4_ + 1) {
                fprintf((FILE *)ref_node," %d",(ulong)(n2o[(&cell)[o2n._4_4_]] + 1));
              }
              fprintf((FILE *)ref_node,"\n");
            }
          }
        }
        pRStack_38 = *(REF_CELL *)(filename_local + 0x28);
        group = pRStack_38->node_per;
        for (max_faceid = ref_private_macro_code_rss; max_faceid <= ref_private_macro_code_rss_1;
            max_faceid = max_faceid + 1) {
          for (faceid = 0; faceid < pRStack_38->max; faceid = faceid + 1) {
            RVar2 = ref_cell_nodes(pRStack_38,faceid,&cell);
            if ((RVar2 == 0) && ((&cell)[group] == max_faceid)) {
              fprintf((FILE *)ref_node," %d",(ulong)(uint)nodes[1]);
              fprintf((FILE *)ref_node,"\n");
            }
          }
        }
        pRStack_38 = *(REF_CELL *)(filename_local + 0x40);
        group = pRStack_38->node_per;
        for (max_faceid = ref_private_macro_code_rss; max_faceid <= ref_private_macro_code_rss_1;
            max_faceid = max_faceid + 1) {
          for (faceid = 0; faceid < pRStack_38->max; faceid = faceid + 1) {
            RVar2 = ref_cell_nodes(pRStack_38,faceid,&cell);
            if ((RVar2 == 0) && ((&cell)[group] == max_faceid)) {
              fprintf((FILE *)ref_node," %d",(ulong)(uint)nodes[2]);
              fprintf((FILE *)ref_node,"\n");
            }
          }
        }
        min_faceid = 8;
        pRStack_38 = *(REF_CELL *)(filename_local + 0x50);
        while (min_faceid < 0x10) {
          group = pRStack_38->node_per;
          for (faceid = 0; faceid < pRStack_38->max; faceid = faceid + 1) {
            RVar2 = ref_cell_nodes(pRStack_38,faceid,&cell);
            if (RVar2 == 0) {
              for (o2n._4_4_ = 0; o2n._4_4_ < group; o2n._4_4_ = o2n._4_4_ + 1) {
                fprintf((FILE *)ref_node," %d",(ulong)(n2o[(&cell)[o2n._4_4_]] + 1));
              }
              fprintf((FILE *)ref_node,"\n");
            }
          }
          min_faceid = min_faceid + 1;
          pRStack_38 = *(REF_CELL *)(filename_local + (long)min_faceid * 8 + 0x10);
        }
        if (_ntri != (REF_INT *)0x0) {
          free(_ntri);
        }
        if (n2o != (REF_INT *)0x0) {
          free(n2o);
        }
        fclose((FILE *)ref_node);
        ref_grid_local._4_4_ = 0;
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c",
               0x5cb,"ref_export_ugrid",(ulong)uVar1,"range");
        ref_grid_local._4_4_ = uVar1;
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c",
             0x5c4,"ref_export_ugrid",(ulong)uVar1,"compact");
      ref_grid_local._4_4_ = uVar1;
    }
  }
  return ref_grid_local._4_4_;
}

Assistant:

REF_FCN static REF_STATUS ref_export_ugrid(REF_GRID ref_grid,
                                           const char *filename) {
  FILE *file;
  REF_NODE ref_node;
  REF_CELL ref_cell;
  REF_INT node;
  REF_INT *o2n, *n2o;
  REF_INT nnode, ntri, nqua, ntet, npyr, npri, nhex;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT node_per, cell;
  REF_INT group;
  REF_INT faceid, min_faceid, max_faceid;

  ref_node = ref_grid_node(ref_grid);

  file = fopen(filename, "w");
  if (NULL == (void *)file) printf("unable to open %s\n", filename);
  RNS(file, "unable to open file");

  nnode = ref_node_n(ref_node);

  ntri = ref_cell_n(ref_grid_tri(ref_grid));
  nqua = ref_cell_n(ref_grid_qua(ref_grid));

  ntet = ref_cell_n(ref_grid_tet(ref_grid));
  npyr = ref_cell_n(ref_grid_pyr(ref_grid));
  npri = ref_cell_n(ref_grid_pri(ref_grid));
  nhex = ref_cell_n(ref_grid_hex(ref_grid));

  fprintf(file, "%d %d %d %d %d %d %d\n", nnode, ntri, nqua, ntet, npyr, npri,
          nhex);

  RSS(ref_node_compact(ref_node, &o2n, &n2o), "compact");

  for (node = 0; node < ref_node_n(ref_node); node++)
    fprintf(file, " %.16e %.16e %.16e\n", ref_node_xyz(ref_node, 0, n2o[node]),
            ref_node_xyz(ref_node, 1, n2o[node]),
            ref_node_xyz(ref_node, 2, n2o[node]));

  RSS(ref_export_faceid_range(ref_grid, &min_faceid, &max_faceid), "range");

  ref_cell = ref_grid_tri(ref_grid);
  node_per = ref_cell_node_per(ref_cell);
  for (faceid = min_faceid; faceid <= max_faceid; faceid++)
    each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
      if (nodes[node_per] == faceid) {
        for (node = 0; node < node_per; node++)
          fprintf(file, " %d", o2n[nodes[node]] + 1);
        fprintf(file, "\n");
      }
    }

  ref_cell = ref_grid_qua(ref_grid);
  node_per = ref_cell_node_per(ref_cell);
  for (faceid = min_faceid; faceid <= max_faceid; faceid++)
    each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
      if (nodes[node_per] == faceid) {
        for (node = 0; node < node_per; node++)
          fprintf(file, " %d", o2n[nodes[node]] + 1);
        fprintf(file, "\n");
      }
    }

  ref_cell = ref_grid_tri(ref_grid);
  node_per = ref_cell_node_per(ref_cell);
  for (faceid = min_faceid; faceid <= max_faceid; faceid++) {
    each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
      if (nodes[node_per] == faceid) {
        fprintf(file, " %d", nodes[3]);
        fprintf(file, "\n");
      }
    }
  }

  ref_cell = ref_grid_qua(ref_grid);
  node_per = ref_cell_node_per(ref_cell);
  for (faceid = min_faceid; faceid <= max_faceid; faceid++) {
    each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
      if (nodes[node_per] == faceid) {
        fprintf(file, " %d", nodes[4]);
        fprintf(file, "\n");
      }
    }
  }

  each_ref_grid_3d_ref_cell(ref_grid, group, ref_cell) {
    node_per = ref_cell_node_per(ref_cell);
    each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
      for (node = 0; node < node_per; node++)
        fprintf(file, " %d", o2n[nodes[node]] + 1);
      fprintf(file, "\n");
    }
  }

  ref_free(n2o);
  ref_free(o2n);

  fclose(file);

  return REF_SUCCESS;
}